

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

bool CoreML::hasSufficientBytesInQuantizedWeightParam(WeightParams *weight,uint64_t units)

{
  int iVar1;
  QuantizationParams *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  undefined1 *puVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  
  pQVar2 = weight->quantization_;
  puVar7 = (undefined1 *)pQVar2;
  if (pQVar2 == (QuantizationParams *)0x0) {
    puVar7 = Specification::_QuantizationParams_default_instance_;
  }
  iVar1 = (weight->floatvalue_).current_size_;
  lVar3 = *(long *)(((ulong)(weight->float16value_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar9 = (0 < iVar1) + 1;
  if (lVar3 == 0) {
    uVar9 = (uint)(0 < iVar1);
  }
  lVar4 = *(long *)(((ulong)(weight->rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  lVar5 = *(long *)(((ulong)(weight->int8rawvalue_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  uVar6 = (uint)(lVar5 == 0);
  uVar9 = (uVar9 - (lVar4 == 0)) + 2;
  iVar10 = 0;
  if (uVar9 - uVar6 < 2) {
    if (((lVar3 == 0) && (uVar9 != uVar6)) && (iVar1 < 1)) {
      if ((lVar4 == 0) ||
         (weight == (WeightParams *)Specification::_WeightParams_default_instance_ ||
          pQVar2 == (QuantizationParams *)0x0)) {
        if (lVar5 != 0) {
          iVar10 = (int)lVar5;
          if (pQVar2 == (QuantizationParams *)0x0) {
            iVar10 = 0;
          }
          if (weight == (WeightParams *)Specification::_WeightParams_default_instance_) {
            iVar10 = 0;
          }
        }
      }
      else {
        iVar10 = (int)lVar4;
      }
    }
    else {
      cVar8 = '\x05';
      if (uVar9 != uVar6) {
        cVar8 = iVar1 < 1;
      }
      if (cVar8 == '\x01') {
        iVar10 = (int)lVar3;
      }
      else if (cVar8 == '\0') {
        iVar10 = iVar1 << 2;
      }
    }
  }
  return ((QuantizationParams *)puVar7)->numberofbits_ * units + 7 >> 3 <= (ulong)(long)iVar10;
}

Assistant:

inline const ::CoreML::Specification::QuantizationParams& WeightParams::_internal_quantization() const {
  const ::CoreML::Specification::QuantizationParams* p = quantization_;
  return p != nullptr ? *p : reinterpret_cast<const ::CoreML::Specification::QuantizationParams&>(
      ::CoreML::Specification::_QuantizationParams_default_instance_);
}